

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseAST.cpp
# Opt level: O3

vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_> *
__thiscall
antlr::BaseAST::findAllPartial
          (vector<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
           *__return_storage_ptr__,BaseAST *this,RefAST *target)

{
  RefAST local_18;
  
  (__return_storage_ptr__->
  super__Vector_base<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<antlr::ASTRefCount<antlr::AST>,_std::allocator<antlr::ASTRefCount<antlr::AST>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = (RefAST)target->ref;
  if ((local_18.ref != (ASTRef *)0x0) && ((local_18.ref)->ptr != (AST *)0x0)) {
    (local_18.ref)->count = (local_18.ref)->count + 1;
    doWorkForFindAll(this,__return_storage_ptr__,&local_18,true);
    ASTRefCount<antlr::AST>::~ASTRefCount(&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<RefAST> BaseAST::findAllPartial(RefAST target)
{
	ANTLR_USE_NAMESPACE(std)vector<RefAST> roots;

	// the empty tree cannot result in an enumeration
	if (target)
		doWorkForFindAll(roots,target,true); // find all matches recursively

	return roots;
}